

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void anon_unknown.dwarf_bf19b::flipUVs<aiAnimMesh>(aiAnimMesh *pMesh)

{
  bool bVar1;
  uint local_18;
  uint local_14;
  uint vIdx;
  uint tcIdx;
  aiAnimMesh *pMesh_local;
  
  if (pMesh != (aiAnimMesh *)0x0) {
    local_14 = 0;
    while ((local_14 < 8 && (bVar1 = aiAnimMesh::HasTextureCoords(pMesh,local_14), bVar1))) {
      for (local_18 = 0; local_18 < pMesh->mNumVertices; local_18 = local_18 + 1) {
        pMesh->mTextureCoords[local_14][local_18].y =
             1.0 - pMesh->mTextureCoords[local_14][local_18].y;
      }
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void flipUVs(aiMeshType* pMesh) {
    if (pMesh == nullptr) { return; }
    // mirror texture y coordinate
    for (unsigned int tcIdx = 0; tcIdx < AI_MAX_NUMBER_OF_TEXTURECOORDS; tcIdx++) {
        if (!pMesh->HasTextureCoords(tcIdx)) {
            break;
        }

        for (unsigned int vIdx = 0; vIdx < pMesh->mNumVertices; vIdx++) {
            pMesh->mTextureCoords[tcIdx][vIdx].y = 1.0f - pMesh->mTextureCoords[tcIdx][vIdx].y;
        }
    }
}